

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O3

void search::movegen::addQuietMove(int move,MoveList *list,Board *pos)

{
  pointer *ppMVar1;
  iterator __position;
  ulong uVar2;
  Move local_8;
  
  if (pos->searchKillers[0][pos->ply] == move) {
    uVar2 = 0xdbba000000000;
  }
  else if (pos->searchKillers[1][pos->ply] == move) {
    uVar2 = 0xc350000000000;
  }
  else {
    uVar2 = (ulong)*(uint *)((long)pos->searchHistory[pos->board[move & 0x7f]] +
                            (ulong)((uint)move >> 5 & 0x1fc)) << 0x20;
  }
  local_8 = (Move)((uint)move | uVar2);
  __position._M_current =
       (list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<board::Move,std::allocator<board::Move>>::_M_realloc_insert<board::Move_const&>
              ((vector<board::Move,std::allocator<board::Move>> *)list,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    ppMVar1 = &(list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  return;
}

Assistant:

inline int Board::getSearchKiller(const int num) const
{
    return searchKillers[num][ply];
}